

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_mark.cpp
# Opt level: O3

Read<signed_char> __thiscall
Omega_h::mark_class_closures
          (Omega_h *this,Mesh *mesh,
          vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_> *class_pairs,
          Graph *nodes2ents)

{
  int *piVar1;
  uint uVar2;
  Alloc *pAVar3;
  Alloc *this_00;
  undefined8 uVar4;
  void *extraout_RDX;
  void *pvVar5;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *extraout_RDX_04;
  char *pcVar6;
  char *pcVar7;
  size_t sVar8;
  ulong uVar9;
  void **ppvVar10;
  bool bVar11;
  Bytes BVar12;
  Read<signed_char> RVar13;
  vector<int,_std::allocator<int>_> dim_class_ids;
  Read<signed_char> class_dim_marks;
  string local_c8;
  Bytes local_a8;
  Bytes local_98;
  Alloc *local_88;
  void *local_80;
  long *local_78;
  undefined8 uStack_70;
  Mesh *local_60;
  vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_> *local_58;
  Graph local_50;
  
  uVar2 = mesh->dim_;
  uVar9 = (ulong)uVar2;
  local_60 = mesh;
  local_58 = class_pairs;
  if (uVar9 < 4) {
    if (nodes2ents[uVar9].a2ab.write_.shared_alloc_.direct_ptr != (void *)0x0) {
      pAVar3 = nodes2ents[uVar9].a2ab.write_.shared_alloc_.alloc;
      if (((ulong)pAVar3 & 1) == 0) {
        sVar8 = pAVar3->size;
      }
      else {
        sVar8 = (ulong)pAVar3 >> 3;
      }
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"");
      Read<signed_char>::Read((Read<signed_char> *)this,(int)(sVar8 >> 2) + -1,'\0',&local_c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
      ppvVar10 = &(nodes2ents->ab2b).write_.shared_alloc_.direct_ptr;
      uVar9 = 0;
      do {
        get_dim_class_ids((vector<int,_std::allocator<int>_> *)&local_c8,(Int)uVar9,local_58);
        pvVar5 = extraout_RDX;
        if (local_c8._M_dataplus._M_p != (pointer)local_c8._M_string_length) {
          local_50.a2ab.write_.shared_alloc_.alloc = (Alloc *)ppvVar10[-3];
          if (((ulong)local_50.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
              local_50.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_50.a2ab.write_.shared_alloc_.alloc =
                   (Alloc *)((local_50.a2ab.write_.shared_alloc_.alloc)->size * 8 + 1);
            }
            else {
              (local_50.a2ab.write_.shared_alloc_.alloc)->use_count =
                   (local_50.a2ab.write_.shared_alloc_.alloc)->use_count + 1;
            }
          }
          pAVar3 = local_50.a2ab.write_.shared_alloc_.alloc;
          local_50.a2ab.write_.shared_alloc_.direct_ptr = ppvVar10[-2];
          local_50.ab2b.write_.shared_alloc_.alloc = ((SharedAlloc *)(ppvVar10 + -1))->alloc;
          if (((ulong)local_50.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
              local_50.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_50.ab2b.write_.shared_alloc_.alloc =
                   (Alloc *)((local_50.ab2b.write_.shared_alloc_.alloc)->size * 8 + 1);
            }
            else {
              (local_50.ab2b.write_.shared_alloc_.alloc)->use_count =
                   (local_50.ab2b.write_.shared_alloc_.alloc)->use_count + 1;
            }
          }
          this_00 = local_50.ab2b.write_.shared_alloc_.alloc;
          local_50.ab2b.write_.shared_alloc_.direct_ptr = *ppvVar10;
          mark_class_closures((Omega_h *)&local_88,local_60,(Int)uVar9,
                              (vector<int,_std::allocator<int>_> *)&local_c8,&local_50);
          if (((ulong)this_00 & 7) == 0 && this_00 != (Alloc *)0x0) {
            piVar1 = &this_00->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(this_00);
              operator_delete(this_00,0x48);
            }
          }
          if (((ulong)pAVar3 & 7) == 0 && pAVar3 != (Alloc *)0x0) {
            piVar1 = &pAVar3->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(pAVar3);
              operator_delete(pAVar3,0x48);
            }
          }
          local_98.write_.shared_alloc_.alloc = *(Alloc **)this;
          if (((ulong)local_98.write_.shared_alloc_.alloc & 7) == 0 &&
              local_98.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_98.write_.shared_alloc_.alloc =
                   (Alloc *)((local_98.write_.shared_alloc_.alloc)->size * 8 + 1);
            }
            else {
              (local_98.write_.shared_alloc_.alloc)->use_count =
                   (local_98.write_.shared_alloc_.alloc)->use_count + 1;
            }
          }
          local_98.write_.shared_alloc_.direct_ptr = *(void **)(this + 8);
          local_a8.write_.shared_alloc_.alloc = local_88;
          if (((ulong)local_88 & 7) == 0 && local_88 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_a8.write_.shared_alloc_.alloc = (Alloc *)(local_88->size * 8 + 1);
            }
            else {
              local_88->use_count = local_88->use_count + 1;
            }
          }
          local_a8.write_.shared_alloc_.direct_ptr = local_80;
          BVar12 = lor_each((Omega_h *)&local_78,&local_98,&local_a8);
          pvVar5 = BVar12.write_.shared_alloc_.direct_ptr;
          pAVar3 = *(Alloc **)this;
          if (((ulong)pAVar3 & 7) == 0 && pAVar3 != (Alloc *)0x0) {
            piVar1 = &pAVar3->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(pAVar3);
              operator_delete(pAVar3,0x48);
              pvVar5 = extraout_RDX_00;
            }
          }
          pAVar3 = local_a8.write_.shared_alloc_.alloc;
          *(long **)this = local_78;
          *(undefined8 *)(this + 8) = uStack_70;
          bVar11 = ((ulong)local_78 & 7) != 0;
          pvVar5 = (void *)CONCAT71((int7)((ulong)pvVar5 >> 8),bVar11 || local_78 == (long *)0x0);
          if ((!bVar11 && local_78 != (long *)0x0) && (entering_parallel == '\x01')) {
            *(int *)(local_78 + 6) = (int)local_78[6] + -1;
            *(long *)this = *local_78 * 8 + 1;
          }
          local_78 = (long *)0x0;
          uStack_70 = 0;
          if (((ulong)local_a8.write_.shared_alloc_.alloc & 7) == 0 &&
              local_a8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(local_a8.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_a8.write_.shared_alloc_.alloc);
              operator_delete(pAVar3,0x48);
              pvVar5 = extraout_RDX_01;
            }
          }
          pAVar3 = local_98.write_.shared_alloc_.alloc;
          if (((ulong)local_98.write_.shared_alloc_.alloc & 7) == 0 &&
              local_98.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(local_98.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_98.write_.shared_alloc_.alloc);
              operator_delete(pAVar3,0x48);
              pvVar5 = extraout_RDX_02;
            }
          }
          pAVar3 = local_88;
          if (((ulong)local_88 & 7) == 0 && local_88 != (Alloc *)0x0) {
            piVar1 = &local_88->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_88);
              operator_delete(pAVar3,0x48);
              pvVar5 = extraout_RDX_03;
            }
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(local_c8._M_dataplus._M_p,
                          local_c8.field_2._M_allocated_capacity - (long)local_c8._M_dataplus._M_p);
          pvVar5 = extraout_RDX_04;
        }
        uVar9 = uVar9 + 1;
        ppvVar10 = ppvVar10 + 4;
      } while (uVar2 + 1 != uVar9);
      RVar13.write_.shared_alloc_.direct_ptr = pvVar5;
      RVar13.write_.shared_alloc_.alloc = (Alloc *)this;
      return (Read<signed_char>)RVar13.write_.shared_alloc_;
    }
    pcVar7 = "nodes2ents[dim].a2ab.exists()";
    pcVar6 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mark.cpp"
    ;
    uVar4 = 0xb1;
  }
  else {
    pcVar7 = "0 <= dim_ && dim_ <= 3";
    pcVar6 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mesh.hpp"
    ;
    uVar4 = 0x33;
  }
  fail("assertion %s failed at %s +%d\n",pcVar7,pcVar6,uVar4);
}

Assistant:

Read<I8> mark_class_closures(Mesh* mesh,
    std::vector<ClassPair> const& class_pairs, Graph nodes2ents[4]) {
  auto dim = mesh->dim();
  OMEGA_H_CHECK(nodes2ents[dim].a2ab.exists());
  auto nnodes = nodes2ents[dim].a2ab.size() - 1;
  auto marks = Read<I8>(nnodes, I8(0));
  for (int class_dim = 0; class_dim <= dim; ++class_dim) {
    auto dim_class_ids = get_dim_class_ids(class_dim, class_pairs);
    if (dim_class_ids.empty()) continue;
    auto class_dim_marks = mark_class_closures(
        mesh, class_dim, dim_class_ids, nodes2ents[class_dim]);
    marks = lor_each(marks, class_dim_marks);
  }
  return marks;
}